

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.h
# Opt level: O2

A * __thiscall di::Context::get<A>(Context *this)

{
  CtxItem *pCVar1;
  A *pAVar2;
  runtime_error *this_00;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pCVar1 = getItem<A>(this);
  pAVar2 = (A *)pCVar1->instancePtr;
  if (pAVar2 == (A *)0x0) {
    if (pCVar1->marker == true) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_58,"Cyclic dependecy while instantiating type: ",&local_59);
      std::operator+(&local_38,&local_58,"1A");
      std::runtime_error::runtime_error(this_00,(string *)&local_38);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pCVar1->marker = true;
    std::function<void_()>::operator()(&pCVar1->factory);
    pCVar1->marker = false;
    pAVar2 = (A *)pCVar1->instancePtr;
  }
  return pAVar2;
}

Assistant:

T& get()
    {
        CtxItem& item = getItem<T>(); // may return derived type

        if (item.instancePtr == nullptr)
        {
            if (item.marker)
                throw std::runtime_error(std::string("Cyclic dependecy while instantiating type: ") + typeid(T).name());

            item.marker = true;
            item.factory();
            item.marker = false;
        }

        return *(static_cast<T*>(item.instancePtr));
    }